

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall
Minisat::Solver::simpleAnalyze
          (Solver *this,CRef confl,vec<Minisat::Lit> *out_learnt,vec<unsigned_int> *reason_clause,
          bool True_confl)

{
  ulong *puVar1;
  char *pcVar2;
  ulong uVar3;
  Lit *pLVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  CRef local_40;
  Lit local_3c;
  vec<Minisat::Lit> *local_38;
  
  iVar6 = (this->trail).sz + -1;
  iVar9 = 0;
  uVar10 = 0xfffffffe;
  local_40 = confl;
  local_38 = out_learnt;
  while( true ) {
    if (local_40 == 0xffffffff) {
      local_3c.x = uVar10 ^ 1;
      vec<Minisat::Lit>::push(local_38,&local_3c);
    }
    else {
      vec<unsigned_int>::push(reason_clause,&local_40);
      puVar1 = (ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + local_40);
      uVar3 = *puVar1;
      if (((uVar10 != 0xfffffffe) && ((uVar3 & 0xfffffffc00000000) == 0x800000000)) &&
         (iVar8 = (int)puVar1[1], ((byte)iVar8 & 1 ^ (this->assigns).data[iVar8 >> 1].value) == 1))
      {
        *(undefined4 *)(puVar1 + 1) = *(undefined4 *)((long)puVar1 + 0xc);
        *(int *)((long)puVar1 + 0xc) = iVar8;
      }
      if ((uint)(uVar10 != 0xfffffffe || True_confl) < (uint)(uVar3 >> 0x22)) {
        uVar5 = (ulong)(uVar10 != 0xfffffffe || True_confl);
        do {
          iVar8 = *(int *)((long)puVar1 + uVar5 * 4 + 8) >> 1;
          pcVar2 = (this->seen).data;
          if ((pcVar2[iVar8] == '\0') && (0 < (this->vardata).data[iVar8].level)) {
            pcVar2[iVar8] = '\x01';
            iVar9 = iVar9 + 1;
            uVar3 = *puVar1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < uVar3 >> 0x22);
      }
    }
    if (iVar9 == 0) break;
    pcVar2 = (this->seen).data;
    pLVar4 = (this->trail).data + iVar6;
    do {
      iVar7 = iVar6;
      uVar10 = pLVar4->x;
      iVar8 = (int)uVar10 >> 1;
      iVar6 = iVar7 + -1;
      pLVar4 = pLVar4 + -1;
    } while (pcVar2[iVar8] == '\0');
    if (iVar7 < this->trailRecord) {
      return;
    }
    local_40 = (this->vardata).data[iVar8].reason;
    pcVar2[iVar8] = '\0';
    if (iVar9 < 1) {
      return;
    }
    iVar9 = iVar9 + -1;
  }
  return;
}

Assistant:

void Solver::simpleAnalyze(CRef confl, vec<Lit> &out_learnt, vec<CRef> &reason_clause, bool True_confl)
{
    int pathC = 0;
    Lit p = lit_Undef;
    int index = trail.size() - 1;

    do {
        if (confl != CRef_Undef) {
            reason_clause.push(confl);
            Clause &c = ca[confl];
            // Special case for binary clauses
            // The first one has to be SAT
            if (p != lit_Undef && c.size() == 2 && value(c[0]) == l_False) {

                assert(value(c[1]) == l_True);
                Lit tmp = c[0];
                c[0] = c[1], c[1] = tmp;
            }
            // if True_confl==true, then choose p begin with the 1th index of c;
            for (int j = (p == lit_Undef && True_confl == false) ? 0 : 1; j < c.size(); j++) {
                Lit q = c[j];
                if (!seen[var(q)] && level(var(q)) > 0) { /* we will not touch level 0 variables */
                    seen[var(q)] = 1;
                    pathC++;
                }
            }
        } else if (confl == CRef_Undef) {
            out_learnt.push(~p);
        }
        // if not break, while() will come to the index of trail blow 0, and fatal error occur;
        if (pathC == 0) break;
        // Select next clause to look at:
        while (!seen[var(trail[index--])])
            ;
        // if the reason cr from the 0-level assigned var, we must break avoid move forth further;
        // but attention that maybe seen[x]=1 and never be clear. However makes no matter;
        if (trailRecord > index + 1) break;
        p = trail[index + 1];
        confl = reason(var(p));
        seen[var(p)] = 0;
        pathC--;

    } while (pathC >= 0);
}